

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O0

void Rml::StringUtilities::TrimTrailingDotZeros(String *string)

{
  ulong uVar1;
  char *pcVar2;
  undefined8 local_20;
  size_t i;
  size_t new_size;
  String *string_local;
  
  i = ::std::__cxx11::string::size();
  local_20 = ::std::__cxx11::string::size();
  do {
    local_20 = local_20 - 1;
    uVar1 = ::std::__cxx11::string::size();
    if (uVar1 <= local_20) {
LAB_00616009:
      uVar1 = ::std::__cxx11::string::size();
      if (i < uVar1) {
        ::std::__cxx11::string::resize((ulong)string);
      }
      return;
    }
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)string);
    if (*pcVar2 == '.') {
      i = local_20;
      goto LAB_00616009;
    }
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)string);
    if (*pcVar2 != '0') goto LAB_00616009;
    i = local_20;
  } while( true );
}

Assistant:

void StringUtilities::TrimTrailingDotZeros(String& string)
{
	size_t new_size = string.size();
	for (size_t i = string.size() - 1; i < string.size(); i--)
	{
		if (string[i] == '.')
		{
			new_size = i;
			break;
		}
		else if (string[i] == '0')
			new_size = i;
		else
			break;
	}

	if (new_size < string.size())
		string.resize(new_size);
}